

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  long lVar2;
  size_t sVar3;
  long lVar4;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  double *pdVar5;
  int j;
  undefined8 *puVar6;
  mat4 *pmVar7;
  undefined8 *puVar8;
  size_t i;
  ulong uVar9;
  byte bVar10;
  vec<3UL,_double> ret;
  DepthBuffer zbuffer;
  TGAImage image;
  array<vec<4UL,_double>,_3UL> screen_coords;
  Model model;
  PhongShader shader;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 in_stack_fffffffffffffac0 [24];
  vec4f local_528;
  string local_508;
  string local_4e8;
  pointer local_4b8;
  pointer in_stack_fffffffffffffb50;
  pointer in_stack_fffffffffffffb58;
  pointer in_stack_fffffffffffffb60;
  pointer in_stack_fffffffffffffb68;
  pointer in_stack_fffffffffffffb70;
  double in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  double in_stack_fffffffffffffb88;
  double in_stack_fffffffffffffb90;
  double local_468 [14];
  Model local_3f8;
  PhongShader local_2f0;
  
  bVar10 = 0;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"obj/african_head.obj","");
  Model::Model(&local_3f8,&local_4e8,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)&stack0xfffffffffffffb60,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&stack0xfffffffffffffb38,800,800);
  pmVar7 = &local_2f0.super_IShader.uniform_ModelView;
  memset(pmVar7,0,0x180);
  local_2f0.super_IShader._vptr_IShader = (_func_int **)&PTR__IShader_00109d30;
  memset(&local_2f0.varying_uv,0,0x138);
  eye.y = (double)in_stack_fffffffffffffb58;
  eye.x = (double)in_stack_fffffffffffffb50;
  eye.z = (double)in_stack_fffffffffffffb60;
  center.y = (double)in_stack_fffffffffffffb70;
  center.x = (double)in_stack_fffffffffffffb68;
  center.z = in_stack_fffffffffffffb78;
  up.y = in_stack_fffffffffffffb88;
  up.x = (double)in_stack_fffffffffffffb80;
  up.z = in_stack_fffffffffffffb90;
  dVar11 = ::eye.x;
  dVar12 = ::eye.y;
  dVar13 = ::eye.z;
  dVar14 = ::center.x;
  dVar15 = ::center.y;
  dVar16 = ::center.z;
  dVar17 = ::up.x;
  dVar18 = ::up.y;
  dVar19 = ::up.z;
  lookat(eye,center,up);
  pdVar5 = (double *)&stack0xfffffffffffffb88;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  viewport(100,100,600,600);
  pdVar5 = (double *)&stack0xfffffffffffffb88;
  pmVar7 = &local_2f0.super_IShader.uniform_Viewport;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  local_528.data[2] = ::eye.z;
  local_528.data[0] = ::eye.x;
  local_528.data[1] = ::eye.y;
  lVar4 = 3;
  do {
    dVar1 = vec<3UL,_double>::operator[](&::center,lVar4 - 1);
    lVar2 = (ulong)(lVar4 != 2) * 8 + 8;
    if (lVar4 == 1) {
      lVar2 = 0;
    }
    *(double *)((long)local_528.data + lVar2) = *(double *)((long)local_528.data + lVar2) - dVar1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  dVar1 = dot<3ul,double>((vec<3UL,_double> *)&local_528,(vec<3UL,_double> *)&local_528);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  projection(-1.0 / dVar1);
  pdVar5 = (double *)&stack0xfffffffffffffb88;
  pmVar7 = &local_2f0.super_IShader.uniform_Projection;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  local_2f0.uniform_light_dir.x = light_dir.x;
  local_2f0.uniform_light_dir.y = light_dir.y;
  local_2f0.uniform_light_dir.z = light_dir.z;
  uVar9 = 0;
  while( true ) {
    pdVar5 = (double *)&stack0xfffffffffffffb88;
    sVar3 = Model::nfaces(&local_3f8);
    if (sVar3 <= uVar9) break;
    lVar4 = 0;
    do {
      PhongShader::vertex(&local_528,&local_2f0,&local_3f8,(int)uVar9,(int)lVar4);
      pdVar5[2] = local_528.data[2];
      pdVar5[3] = local_528.data[3];
      *pdVar5 = local_528.data[0];
      pdVar5[1] = local_528.data[1];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 4;
    } while (lVar4 != 3);
    puVar6 = (undefined8 *)&stack0xfffffffffffffb88;
    puVar8 = (undefined8 *)&stack0xfffffffffffffa78;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar8 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    pts._M_elems[0].data[1] = dVar12;
    pts._M_elems[0].data[0] = dVar11;
    pts._M_elems[0].data[2] = dVar13;
    pts._M_elems[0].data[3] = dVar14;
    pts._M_elems[1].data[0] = dVar15;
    pts._M_elems[1].data[1] = dVar16;
    pts._M_elems[1].data[2] = dVar17;
    pts._M_elems[1].data[3] = dVar18;
    pts._M_elems[2].data[0] = dVar19;
    pts._M_elems[2].data[1] = (double)in_stack_fffffffffffffac0._0_8_;
    pts._M_elems[2].data[2] = (double)in_stack_fffffffffffffac0._8_8_;
    pts._M_elems[2].data[3] = (double)in_stack_fffffffffffffac0._16_8_;
    triangle(&local_3f8,pts,&local_2f0.super_IShader,(TGAImage *)&stack0xfffffffffffffb60,
             (DepthBuffer *)&stack0xfffffffffffffb38);
    uVar9 = uVar9 + 1;
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"output.tga","");
  __n = 1;
  TGAImage::write_tga_file((TGAImage *)&stack0xfffffffffffffb60,&local_508,true,true);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  DepthBuffer::write((DepthBuffer *)&stack0xfffffffffffffb38,0x107070,__buf,__n);
  IShader::~IShader(&local_2f0.super_IShader);
  if (local_4b8 != (pointer)0x0) {
    operator_delete(local_4b8,(long)in_stack_fffffffffffffb58 - (long)local_4b8);
  }
  if (in_stack_fffffffffffffb60 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffb60,
                    (long)in_stack_fffffffffffffb70 - (long)in_stack_fffffffffffffb60);
  }
  Model::~Model(&local_3f8);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    // GouraudShader shader;
    PhongShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}